

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::RedirectedStdErr::RedirectedStdErr(RedirectedStdErr *this)

{
  ostream *poVar1;
  ostream *redirectionStream;
  ostream *originalStream;
  double __z;
  RedirectedStdErr *this_local;
  
  ReusableStringStream::ReusableStringStream(&this->m_rss);
  poVar1 = cerr();
  redirectionStream = ReusableStringStream::get(&this->m_rss);
  RedirectedStream::RedirectedStream(&this->m_cerr,poVar1,redirectionStream);
  clog(__z);
  poVar1 = ReusableStringStream::get(&this->m_rss);
  RedirectedStream::RedirectedStream(&this->m_clog,originalStream,poVar1);
  return;
}

Assistant:

RedirectedStdErr::RedirectedStdErr()
    :   m_cerr( Catch::cerr(), m_rss.get() ),
        m_clog( Catch::clog(), m_rss.get() )
    {}